

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbuffer.hpp
# Opt level: O2

void __thiscall msgpack::v1::sbuffer::sbuffer(sbuffer *this,size_t initsz)

{
  char *pcVar1;
  undefined8 *puVar2;
  
  this->m_size = 0;
  this->m_alloc = initsz;
  if (initsz == 0) {
    this->m_data = (char *)0x0;
  }
  else {
    pcVar1 = (char *)malloc(initsz);
    this->m_data = pcVar1;
    if (pcVar1 == (char *)0x0) {
      puVar2 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar2 = __cxa_init_primary_exception;
      __cxa_throw(puVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  return;
}

Assistant:

sbuffer(size_t initsz = MSGPACK_SBUFFER_INIT_SIZE):m_size(0), m_alloc(initsz)
    {
        if(initsz == 0) {
            m_data = MSGPACK_NULLPTR;
        } else {
            m_data = (char*)::malloc(initsz);
            if(!m_data) {
                throw std::bad_alloc();
            }
        }
    }